

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O2

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
UpdateSuccessForScaledWhiteNoise<BitDepthParams<unsigned_short,_10,_true>_>::TestBody
          (UpdateSuccessForScaledWhiteNoise<BitDepthParams<unsigned_short,_10,_true>_> *this)

{
  double sigma;
  aom_noise_strength_lut_t *paVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  int *piVar7;
  SEARCH_METHODS *pSVar8;
  ushort uVar9;
  int i;
  int x;
  ulong uVar10;
  long lVar11;
  double dVar12;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff64;
  aom_noise_strength_lut_t lut;
  AssertionResult gtest_ar_10;
  AssertHelper in_stack_ffffffffffffff88;
  double std;
  
  for (uVar4 = 0; uVar4 != 0x80; uVar4 = uVar4 + 1) {
    sigma = *(double *)(&DAT_00aa84c0 + (ulong)(uVar4 < 0x40) * 8);
    uVar9 = 0xf7;
    if (uVar4 < 0x40) {
      uVar9 = 6;
    }
    for (uVar10 = 0; uVar10 != 0x80; uVar10 = uVar10 + 1) {
      uVar5 = uVar10 | uVar4 << 7;
      for (lVar11 = -0x18; lVar11 != 0; lVar11 = lVar11 + 8) {
        dVar12 = anon_unknown.dwarf_73c935::randn
                           (&(this->
                             super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                             random_,sigma);
        uVar2 = (uint)(dVar12 + (double)uVar9);
        if (0xfe < (int)uVar2) {
          uVar2 = 0xff;
        }
        *(short *)(*(long *)((long)(this->
                                   super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>
                                   ).denoised_ptr_ + lVar11) + uVar5 * 2) =
             (short)((uVar2 & 0xff) << 2);
        *(ushort *)
         (*(long *)((long)(this->
                          super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                          noise_ptr_ + lVar11) + uVar5 * 2) = uVar9 << 2;
      }
    }
  }
  lut.points._0_1_ = '\x01';
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (&(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
              flat_blocks_,
             (long)(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                   flat_blocks_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                   flat_blocks_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(value_type_conflict3 *)&lut);
  gtest_ar_10.success_ = false;
  gtest_ar_10._1_3_ = 0;
  iVar3 = NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>::NoiseModelUpdate
                    (&this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>,
                     0x10);
  testing::internal::EqHelper::
  Compare<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_1510_m_ab_s[P]aom_aom_dsp_noise_model_h:206:1),_int,_nullptr>
            ((EqHelper *)&lut,"AOM_NOISE_STATUS_OK","this->NoiseModelUpdate()",
             (anon_enum_32 *)&gtest_ar_10,(int *)&stack0xffffffffffffff60);
  if ((char)lut.points == '\0') {
    testing::Message::Message((Message *)&gtest_ar_10);
    if (lut._8_8_ == 0) {
      pSVar8 = "";
    }
    else {
      pSVar8 = *(SEARCH_METHODS **)lut._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x2ce,(char *)pSVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&gtest_ar_10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60);
    if ((long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&lut.num_points);
  uVar2 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).model_.n;
  lVar11 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  do {
    if (lVar11 == 3) {
      gtest_ar_10.success_ = true;
      gtest_ar_10._1_3_ = 0;
      piVar7 = &(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).model_
                .latest_state[0].strength_solver.eqns.n;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&lut,"20","model.latest_state[0].strength_solver.eqns.n",
                 (int *)&gtest_ar_10,piVar7);
      if ((char)lut.points == '\0') {
        testing::Message::Message((Message *)&gtest_ar_10);
        if (lut._8_8_ == 0) {
          pSVar8 = "";
        }
        else {
          pSVar8 = *(SEARCH_METHODS **)lut._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2e7,(char *)pSVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&gtest_ar_10);
        paVar1 = &lut;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60);
        plVar6 = (long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_);
      }
      else {
        ::std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&lut.num_points);
        for (lVar11 = 0; lVar11 < *piVar7; lVar11 = lVar11 + 1) {
          testing::internal::DoubleNearPredFormat
                    ((char *)CONCAT44(in_stack_ffffffffffffff64,iVar3),in_stack_ffffffffffffff58,
                     (char *)CONCAT71(lut.points._1_7_,(char)lut.points),
                     (double)in_stack_ffffffffffffff88.data_,
                     (double)gtest_ar_10.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(double)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_));
          if ((char)lut.points == '\0') {
            testing::Message::Message((Message *)&gtest_ar_10);
            pSVar8 = "";
            if (lut._8_8_ != 0) {
              pSVar8 = *(SEARCH_METHODS **)lut._8_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                       ,0x2ed,(char *)pSVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&gtest_ar_10);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60)
            ;
            if ((long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) + 8))();
            }
          }
          ::std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&lut.num_points);
          testing::internal::DoubleNearPredFormat
                    ((char *)CONCAT44(in_stack_ffffffffffffff64,iVar3),in_stack_ffffffffffffff58,
                     (char *)CONCAT71(lut.points._1_7_,(char)lut.points),
                     (double)in_stack_ffffffffffffff88.data_,
                     (double)gtest_ar_10.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(double)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_));
          if ((char)lut.points == '\0') {
            testing::Message::Message((Message *)&gtest_ar_10);
            pSVar8 = "";
            if (lut._8_8_ != 0) {
              pSVar8 = *(SEARCH_METHODS **)lut._8_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                       ,0x2f0,(char *)pSVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&gtest_ar_10);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60)
            ;
            if ((long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) + 8))();
            }
          }
          ::std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&lut.num_points);
        }
        aom_noise_strength_solver_fit_piecewise
                  (&(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                    model_.latest_state[0].strength_solver,2,&lut);
        iVar3 = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_10,"2","lut.num_points",(int *)&stack0xffffffffffffff60,
                   &lut.num_points);
        if (gtest_ar_10.success_ != false) {
          ::std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_10.message_);
          testing::internal::DoubleNearPredFormat
                    ((char *)CONCAT44(in_stack_ffffffffffffff64,iVar3),in_stack_ffffffffffffff58,
                     (char *)CONCAT71(lut.points._1_7_,(char)lut.points),
                     (double)in_stack_ffffffffffffff88.data_,
                     (double)gtest_ar_10.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(double)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_));
          if (gtest_ar_10.success_ == false) {
            testing::Message::Message((Message *)&stack0xffffffffffffff60);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_10.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pSVar8 = "";
            }
            else {
              pSVar8 = *(SEARCH_METHODS **)
                        gtest_ar_10.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff88,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                       ,0x2f9,(char *)pSVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff88,(Message *)&stack0xffffffffffffff60)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff88)
            ;
            if ((long *)CONCAT44(in_stack_ffffffffffffff64,iVar3) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff64,iVar3) + 8))();
            }
          }
          ::std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_10.message_);
          testing::internal::DoubleNearPredFormat
                    ((char *)CONCAT44(in_stack_ffffffffffffff64,iVar3),in_stack_ffffffffffffff58,
                     (char *)CONCAT71(lut.points._1_7_,(char)lut.points),
                     (double)in_stack_ffffffffffffff88.data_,
                     (double)gtest_ar_10.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(double)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_));
          if (gtest_ar_10.success_ == false) {
            testing::Message::Message((Message *)&stack0xffffffffffffff60);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_10.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pSVar8 = "";
            }
            else {
              pSVar8 = *(SEARCH_METHODS **)
                        gtest_ar_10.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff88,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                       ,0x2fa,(char *)pSVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff88,(Message *)&stack0xffffffffffffff60)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff88)
            ;
            if ((long *)CONCAT44(in_stack_ffffffffffffff64,iVar3) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff64,iVar3) + 8))();
            }
          }
          ::std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_10.message_);
          testing::internal::DoubleNearPredFormat
                    ((char *)CONCAT44(in_stack_ffffffffffffff64,iVar3),in_stack_ffffffffffffff58,
                     (char *)CONCAT71(lut.points._1_7_,(char)lut.points),
                     (double)in_stack_ffffffffffffff88.data_,
                     (double)gtest_ar_10.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(double)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_));
          if (gtest_ar_10.success_ == false) {
            testing::Message::Message((Message *)&stack0xffffffffffffff60);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_10.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pSVar8 = "";
            }
            else {
              pSVar8 = *(SEARCH_METHODS **)
                        gtest_ar_10.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff88,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                       ,0x2fb,(char *)pSVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff88,(Message *)&stack0xffffffffffffff60)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff88)
            ;
            if ((long *)CONCAT44(in_stack_ffffffffffffff64,iVar3) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff64,iVar3) + 8))();
            }
          }
          ::std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_10.message_);
          testing::internal::DoubleNearPredFormat
                    ((char *)CONCAT44(in_stack_ffffffffffffff64,iVar3),in_stack_ffffffffffffff58,
                     (char *)CONCAT71(lut.points._1_7_,(char)lut.points),
                     (double)in_stack_ffffffffffffff88.data_,
                     (double)gtest_ar_10.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(double)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_));
          if (gtest_ar_10.success_ == false) {
            testing::Message::Message((Message *)&stack0xffffffffffffff60);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_10.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pSVar8 = "";
            }
            else {
              pSVar8 = *(SEARCH_METHODS **)
                        gtest_ar_10.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff88,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                       ,0x2fc,(char *)pSVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff88,(Message *)&stack0xffffffffffffff60)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff88)
            ;
            if ((long *)CONCAT44(in_stack_ffffffffffffff64,iVar3) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff64,iVar3) + 8))();
            }
          }
          ::std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_10.message_);
          aom_noise_strength_lut_free(&lut);
          return;
        }
        testing::Message::Message((Message *)&stack0xffffffffffffff60);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_10.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pSVar8 = "";
        }
        else {
          pSVar8 = *(SEARCH_METHODS **)
                    gtest_ar_10.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2f8,(char *)pSVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff88,(Message *)&stack0xffffffffffffff60);
        paVar1 = (aom_noise_strength_lut_t *)&gtest_ar_10;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff88);
        plVar6 = (long *)CONCAT44(in_stack_ffffffffffffff64,iVar3);
      }
      piVar7 = &paVar1->num_points;
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 8))();
      }
LAB_004c7576:
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)piVar7);
      return;
    }
    for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(in_stack_ffffffffffffff64,iVar3),in_stack_ffffffffffffff58,
                 (char *)CONCAT71(lut.points._1_7_,(char)lut.points),
                 (double)in_stack_ffffffffffffff88.data_,
                 (double)gtest_ar_10.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,(double)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_));
      if ((char)lut.points == '\0') {
        testing::Message::Message((Message *)&gtest_ar_10);
        pSVar8 = "";
        if (lut._8_8_ != 0) {
          pSVar8 = *(SEARCH_METHODS **)lut._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2d5,(char *)pSVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&gtest_ar_10);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60);
        if ((long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&lut.num_points);
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(in_stack_ffffffffffffff64,iVar3),in_stack_ffffffffffffff58,
                 (char *)CONCAT71(lut.points._1_7_,(char)lut.points),
                 (double)in_stack_ffffffffffffff88.data_,
                 (double)gtest_ar_10.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,(double)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_));
      if ((char)lut.points == '\0') {
        testing::Message::Message((Message *)&gtest_ar_10);
        pSVar8 = "";
        if (lut._8_8_ != 0) {
          pSVar8 = *(SEARCH_METHODS **)lut._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2d6,(char *)pSVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&gtest_ar_10);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60);
        if ((long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&lut.num_points);
    }
    if (lVar11 != 0) {
      gtest_ar_10._0_4_ = uVar2 + 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&lut,"n + 1","model.latest_state[c].eqns.n",(int *)&gtest_ar_10,
                 &(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                  model_.latest_state[lVar11].eqns.n);
      if ((char)lut.points == '\0') {
        testing::Message::Message((Message *)&gtest_ar_10);
        if (lut._8_8_ == 0) {
          pSVar8 = "";
        }
        else {
          pSVar8 = *(SEARCH_METHODS **)lut._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2d9,(char *)pSVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&gtest_ar_10);
      }
      else {
        ::std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&lut.num_points);
        gtest_ar_10._0_4_ = uVar2 + 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&lut,"n + 1","model.combined_state[c].eqns.n",(int *)&gtest_ar_10,
                   &(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                    model_.combined_state[lVar11].eqns.n);
        if ((char)lut.points != '\0') {
          ::std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&lut.num_points);
          testing::internal::DoubleNearPredFormat
                    ((char *)CONCAT44(in_stack_ffffffffffffff64,iVar3),in_stack_ffffffffffffff58,
                     (char *)CONCAT71(lut.points._1_7_,(char)lut.points),
                     (double)in_stack_ffffffffffffff88.data_,
                     (double)gtest_ar_10.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(double)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_));
          if ((char)lut.points == '\0') {
            testing::Message::Message((Message *)&gtest_ar_10);
            pSVar8 = "";
            if (lut._8_8_ != 0) {
              pSVar8 = *(SEARCH_METHODS **)lut._8_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                       ,0x2dd,(char *)pSVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&gtest_ar_10);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60)
            ;
            if ((long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) + 8))();
            }
          }
          ::std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&lut.num_points);
          testing::internal::DoubleNearPredFormat
                    ((char *)CONCAT44(in_stack_ffffffffffffff64,iVar3),in_stack_ffffffffffffff58,
                     (char *)CONCAT71(lut.points._1_7_,(char)lut.points),
                     (double)in_stack_ffffffffffffff88.data_,
                     (double)gtest_ar_10.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(double)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_));
          if ((char)lut.points == '\0') {
            testing::Message::Message((Message *)&gtest_ar_10);
            pSVar8 = "";
            if (lut._8_8_ != 0) {
              pSVar8 = *(SEARCH_METHODS **)lut._8_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                       ,0x2de,(char *)pSVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&gtest_ar_10);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60)
            ;
            if ((long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) + 8))();
            }
          }
          ::std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&lut.num_points);
          goto LAB_004c7138;
        }
        testing::Message::Message((Message *)&gtest_ar_10);
        if (lut._8_8_ == 0) {
          pSVar8 = "";
        }
        else {
          pSVar8 = *(SEARCH_METHODS **)lut._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2da,(char *)pSVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&gtest_ar_10);
      }
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60);
      if ((long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_10._4_4_,gtest_ar_10._0_4_) + 8))();
      }
      piVar7 = &lut.num_points;
      goto LAB_004c7576;
    }
LAB_004c7138:
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, UpdateSuccessForScaledWhiteNoise) {
  aom_noise_model_t &model = this->model_;
  const int width = this->kWidth;
  const int height = this->kHeight;

  const double kCoeffEps = 0.055;
  const double kLowStd = 1;
  const double kHighStd = 4;
  const int shift = this->kBitDepth - 8;
  for (int y = 0; y < height; ++y) {
    for (int x = 0; x < width; ++x) {
      for (int c = 0; c < 3; ++c) {
        // The image data is bimodal:
        // Bottom half has low intensity and low noise strength
        // Top half has high intensity and high noise strength
        const int avg = (y < height / 2) ? 4 : 245;
        const double std = (y < height / 2) ? kLowStd : kHighStd;
        this->data_ptr_[c][y * width + x] =
            ((uint8_t)std::min((int)255,
                               (int)(2 + avg + randn(&this->random_, std))))
            << shift;
        this->denoised_ptr_[c][y * width + x] = (2 + avg) << shift;
      }
    }
  }
  // Label all blocks as flat for the update
  this->flat_blocks_.assign(this->flat_blocks_.size(), 1);
  EXPECT_EQ(AOM_NOISE_STATUS_OK, this->NoiseModelUpdate());

  const int n = model.n;
  // The noise is uncorrelated spatially and with the y channel.
  // All coefficients should be reasonably close to zero.
  for (int c = 0; c < 3; ++c) {
    for (int i = 0; i < n; ++i) {
      EXPECT_NEAR(0, model.latest_state[c].eqns.x[i], kCoeffEps);
      EXPECT_NEAR(0, model.combined_state[c].eqns.x[i], kCoeffEps);
    }
    if (c > 0) {
      ASSERT_EQ(n + 1, model.latest_state[c].eqns.n);
      ASSERT_EQ(n + 1, model.combined_state[c].eqns.n);

      // The correlation to the y channel should be low (near zero)
      EXPECT_NEAR(0, model.latest_state[c].eqns.x[n], kCoeffEps);
      EXPECT_NEAR(0, model.combined_state[c].eqns.x[n], kCoeffEps);
    }
  }

  // Noise strength should vary between kLowStd and kHighStd.
  const double kStdEps = 0.15;
  // We have to normalize fitted standard deviation based on bit depth.
  const double normalize = (1 << shift);

  ASSERT_EQ(20, model.latest_state[0].strength_solver.eqns.n);
  for (int i = 0; i < model.latest_state[0].strength_solver.eqns.n; ++i) {
    const double a = i / 19.0;
    const double expected = (kLowStd * (1.0 - a) + kHighStd * a);
    EXPECT_NEAR(expected,
                model.latest_state[0].strength_solver.eqns.x[i] / normalize,
                kStdEps);
    EXPECT_NEAR(expected,
                model.combined_state[0].strength_solver.eqns.x[i] / normalize,
                kStdEps);
  }

  // If we fit a piecewise linear model, there should be two points:
  // one near kLowStd at 0, and the other near kHighStd and 255.
  aom_noise_strength_lut_t lut;
  aom_noise_strength_solver_fit_piecewise(
      &model.latest_state[0].strength_solver, 2, &lut);
  ASSERT_EQ(2, lut.num_points);
  EXPECT_NEAR(0, lut.points[0][0], 1e-4);
  EXPECT_NEAR(kLowStd, lut.points[0][1] / normalize, kStdEps);
  EXPECT_NEAR((1 << this->kBitDepth) - 1, lut.points[1][0], 1e-5);
  EXPECT_NEAR(kHighStd, lut.points[1][1] / normalize, kStdEps);
  aom_noise_strength_lut_free(&lut);
}